

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O1

Var Js::JavascriptString::EntryAt(RecyclableObject *function,CallInfo callInfo,...)

{
  uint uVar1;
  ScriptContext *pSVar2;
  code *pcVar3;
  double T1;
  Type this;
  bool bVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var aValue;
  INT64 IVar7;
  RecyclableObject *pRVar8;
  ulong uVar9;
  int in_stack_00000010;
  undefined1 local_88 [8];
  ArgumentReader args;
  JavascriptString *pThis;
  CallInfo local_68;
  CallInfo callInfo_local;
  Var value;
  undefined1 local_50 [8];
  JsReentLock jsReentLock;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_68 = callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != local_68._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x2c4,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00d21f09;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_88 = (undefined1  [8])local_68;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_88,&local_68);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_50 = (undefined1  [8])pSVar2->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_50)->noJsReentrancy;
  ((ThreadContext *)local_50)->noJsReentrancy = true;
  if (((ulong)local_68 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptString.cpp"
                                ,0x2c8,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar4) goto LAB_00d21f09;
    *puVar6 = 0;
  }
  args.super_Arguments.Values = (Type)0x0;
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  GetThisStringArgument
            ((ArgumentReader *)local_88,pSVar2,L"String.prototype.at",
             (JavascriptString **)&args.super_Arguments.Values);
  JsReentLock::MutateArrayObject((JsReentLock *)local_50);
  this = args.super_Arguments.Values;
  *(bool *)((long)local_50 + 0x108) = true;
  uVar1 = *(uint *)(args.super_Arguments.Values + 3);
  if (((ulong)local_88 & 0xfffffe) == 0) {
    IVar7 = 0;
  }
  else {
    *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    aValue = Arguments::operator[]((Arguments *)local_88,1);
    if (((ulong)aValue & 0x1ffff00000000) != 0x1000000000000 &&
        ((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) {
LAB_00d21f09:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    if (((ulong)aValue & 0xffff000000000000) == 0x1000000000000) {
      T1 = (double)(int)aValue;
    }
    else {
      T1 = JavascriptConversion::ToInteger_Full(aValue,pSVar2);
    }
    IVar7 = NumberUtilities::TryToInt64(T1);
    JsReentLock::MutateArrayObject((JsReentLock *)local_50);
    *(bool *)((long)local_50 + 0x108) = true;
  }
  uVar9 = (ulong)((uint)(IVar7 >> 0x3f) & uVar1) + IVar7;
  if (uVar9 < uVar1) {
    BVar5 = GetItemAt((JavascriptString *)this,(charcount_t)uVar9,(Var *)&callInfo_local);
    if (BVar5 != 0) {
      pRVar8 = (RecyclableObject *)BreakSpeculation(callInfo_local);
      goto LAB_00d21eed;
    }
  }
  pRVar8 = (((pSVar2->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
LAB_00d21eed:
  *(undefined1 *)((long)local_50 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return pRVar8;
}

Assistant:

Var JavascriptString::EntryAt(RecyclableObject* function, CallInfo callInfo, ...) {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());

        Assert(!(callInfo.Flags & CallFlags_New));

        JavascriptString * pThis = nullptr;

        // 1. Let O be ? RequireObjectCoercible(this value).
        // 2. Let S be ? ToString(O).
        JS_REENTRANT(jsReentLock, GetThisStringArgument(args, scriptContext, _u("String.prototype.at"), &pThis));

        // 3. Let len be the length of S.
        charcount_t len = pThis->GetLength();

        // 4. Let relativeIndex be ? ToInteger(index).
        int64_t relativeIndex = 0;

        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, relativeIndex = NumberUtilities::TryToInt64(JavascriptConversion::ToInteger(args[1], scriptContext)));
        }

        // 5. If relativeIndex >= 0, then
        //     a. Let k be relativeIndex.
        // 6. Else,
        //     a. Let k be len + relativeIndex.
        int64_t k = relativeIndex;
        
        if (relativeIndex < 0)
        {
            k += len;
        }
        
        // 7. If k < 0 or k >= len, then return undefined.
        if (k < 0 || k >= (int64_t)len)
        {
            return scriptContext->GetLibrary()->GetUndefined();
        }
        
        Var value;
        // 8. Return the String value consisting of only the code unit at position k in S.
        if (pThis->GetItemAt((charcount_t)k, &value))
        {
#ifdef ENABLE_SPECTRE_RUNTIME_MITIGATIONS
            value = BreakSpeculation(value);
#endif
            return value;
        }
        else
        {
            // Yes, i except this to be
            return scriptContext->GetLibrary()->GetUndefined();
        }
    }